

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O3

void __thiscall kj::_::BTreeImpl::logInconsistency(BTreeImpl *this)

{
  char *pcVar1;
  size_t sVar2;
  String local_28;
  
  if (Debug::minSeverity < 3) {
    getStackTrace();
    Debug::log<char_const(&)[271],kj::String>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
               ,0xf2,ERROR,
               "\"BTreeIndex detected tree state inconsistency. This can happen if you create a kj::Table \" \"with a b-tree index and you modify the rows in the table post-indexing in a way that would \" \"change their ordering. This is a serious bug which will lead to undefined behavior.\" \"\\nstack: \", kj::getStackTrace()"
               ,(char (*) [271])
                "BTreeIndex detected tree state inconsistency. This can happen if you create a kj::Table with a b-tree index and you modify the rows in the table post-indexing in a way that would change their ordering. This is a serious bug which will lead to undefined behavior.\nstack: "
               ,&local_28);
    sVar2 = local_28.content.size_;
    pcVar1 = local_28.content.ptr;
    if (local_28.content.ptr != (char *)0x0) {
      local_28.content.ptr = (char *)0x0;
      local_28.content.size_ = 0;
      (*(code *)**(undefined8 **)local_28.content.disposer)
                (local_28.content.disposer,pcVar1,1,sVar2,sVar2,0);
    }
  }
  return;
}

Assistant:

BTreeImpl::Iterator BTreeImpl::insert(const SearchKey& searchKey) {
  // Like search() but ensures that there is room in the leaf node to insert a new row.

  // If we split the root node it will generate two new nodes. If we split any other node in the
  // path it will generate one new node. `height` doesn't count leaf nodes, but we can equivalently
  // think of it as not counting the root node, so in the worst case we may allocate height + 2
  // new nodes.
  //
  // (Also note that if the tree is currently empty, then `tree` points to a dummy root node in
  // read-only memory. We definitely need to allocate a real tree node array in this case, and
  // we'll start out allocating space for four nodes, which will be all we need up to 28 rows.)
  if (freelistSize < height + 2) {
    if (height > 0 && !tree[0].parent.isFull() && freelistSize >= height) {
      // Slight optimization: The root node is not full, so we're definitely not going to split it.
      // That means that the maximum allocations we might do is equal to `height`, not
      // `height + 2`, and we have that much space, so no need to grow yet.
      //
      // This optimization is particularly important for small trees, e.g. when treeCapacity is 4
      // and the tree so far consists of a root and two children, we definitely don't need to grow
      // the tree yet.
    } else {
      growTree();

      if (freelistHead == 0) {
        // We have no root yet. Allocate one.
        KJ_ASSERT(alloc<Parent>().index == 0);
      }
    }
  }

  uint pos = 0;

  // Track grandparent node and child index within grandparent.
  Parent* parent = nullptr;
  uint indexInParent = 0;

  for (auto i KJ_UNUSED: zeroTo(height)) {
    Parent& node = insertHelper(searchKey, tree[pos].parent, parent, indexInParent, pos);

    parent = &node;
    indexInParent = searchKey.search(node);
    pos = node.children[indexInParent];
  }

  Leaf& leaf = insertHelper(searchKey, tree[pos].leaf, parent, indexInParent, pos);

  // Fun fact: Unlike erase(), there's no need to climb back up the tree modifying keys, because
  // either the newly-inserted node will not be the last in the leaf (and thus parent keys aren't
  // modified), or the leaf is the last leaf in the tree (and thus there's no parent key to
  // modify).

  return { tree, &leaf, searchKey.search(leaf) };
}